

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  float fVar1;
  ImGuiWindow *window;
  undefined1 auVar2 [16];
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiID id;
  int iVar5;
  ImGuiOldColumns *pIVar6;
  ImGuiOldColumnData *pIVar7;
  ImGuiOldColumnData *pIVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ImGuiContext *g;
  ulong uVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined4 local_58;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xe92,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  if ((window->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    __assert_fail("window->DC.CurrentColumns == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xe93,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  id = GetColumnsID(str_id,columns_count);
  pIVar6 = FindOrCreateColumns(window,id);
  if (pIVar6->ID != id) {
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xe98,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  pIVar6->Current = 0;
  pIVar6->Count = columns_count;
  pIVar6->Flags = flags;
  (window->DC).CurrentColumns = pIVar6;
  pIVar6->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar6->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar3 = (window->ClipRect).Max;
  (pIVar6->HostInitialClipRect).Min = (window->ClipRect).Min;
  (pIVar6->HostInitialClipRect).Max = IVar3;
  IVar3 = (window->ParentWorkRect).Max;
  (pIVar6->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
  (pIVar6->HostBackupParentWorkRect).Max = IVar3;
  IVar3 = (window->WorkRect).Max;
  (window->ParentWorkRect).Min = (window->WorkRect).Min;
  (window->ParentWorkRect).Max = IVar3;
  fVar16 = (window->WindowPadding).x;
  auVar18 = ZEXT416((uint)(fVar16 * 0.5));
  auVar2 = vcmpss_avx(ZEXT416((uint)window->WindowBorderSize),auVar18,2);
  auVar2 = vblendvps_avx(ZEXT416((uint)window->WindowBorderSize),auVar18,auVar2);
  fVar1 = (pIVar4->Style).ItemSpacing.x;
  auVar18._0_4_ = (int)auVar2._0_4_;
  auVar18._4_4_ = (int)auVar2._4_4_;
  auVar18._8_4_ = (int)auVar2._8_4_;
  auVar18._12_4_ = (int)auVar2._12_4_;
  auVar18 = vcvtdq2ps_avx(auVar18);
  fVar15 = (window->WorkRect).Max.x;
  auVar17 = ZEXT416((uint)(fVar1 - fVar16));
  auVar2 = vcmpss_avx(ZEXT816(0) << 0x40,auVar17,2);
  auVar2 = vandps_avx(auVar2,auVar17);
  auVar18 = vminss_avx(ZEXT416((uint)((fVar1 + fVar15) - auVar2._0_4_)),
                       ZEXT416((uint)(fVar15 + auVar18._0_4_)));
  fVar16 = auVar2._0_4_ + ((window->DC).Indent.x - fVar1);
  pIVar6->OffMinX = fVar16;
  auVar17 = ZEXT416((uint)(fVar16 + 1.0));
  auVar18 = ZEXT416((uint)(auVar18._0_4_ - (window->Pos).x));
  auVar2 = vcmpss_avx(auVar17,auVar18,2);
  auVar2 = vblendvps_avx(auVar17,auVar18,auVar2);
  pIVar6->OffMaxX = auVar2._0_4_;
  fVar16 = (window->DC).CursorPos.y;
  pIVar6->LineMaxY = fVar16;
  pIVar6->LineMinY = fVar16;
  uVar11 = (pIVar6->Columns).Size;
  uVar9 = columns_count + 1;
  if (uVar11 == uVar9 || uVar11 == 0) {
    pIVar6->IsFirstFrame = uVar11 == 0;
    if (uVar11 != 0) goto LAB_0019dfb2;
    iVar13 = (pIVar6->Columns).Capacity;
  }
  else {
    iVar13 = (pIVar6->Columns).Capacity;
    if (iVar13 < 0) {
      iVar13 = 0;
      pIVar7 = (ImGuiOldColumnData *)MemAlloc(0);
      pIVar8 = (pIVar6->Columns).Data;
      if (pIVar8 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar7,pIVar8,(long)(pIVar6->Columns).Size * 0x1c);
        MemFree((pIVar6->Columns).Data);
      }
      (pIVar6->Columns).Data = pIVar7;
      (pIVar6->Columns).Capacity = 0;
    }
    (pIVar6->Columns).Size = 0;
    pIVar6->IsFirstFrame = true;
  }
  if (iVar13 <= columns_count) {
    pIVar7 = (ImGuiOldColumnData *)MemAlloc((ulong)uVar9 * 0x1c);
    pIVar8 = (pIVar6->Columns).Data;
    if (pIVar8 != (ImGuiOldColumnData *)0x0) {
      memcpy(pIVar7,pIVar8,(long)(pIVar6->Columns).Size * 0x1c);
      MemFree((pIVar6->Columns).Data);
    }
    (pIVar6->Columns).Data = pIVar7;
    (pIVar6->Columns).Capacity = uVar9;
  }
  iVar13 = (pIVar6->Columns).Size;
  uVar11 = 0;
  do {
    if (iVar13 == (pIVar6->Columns).Capacity) {
      if (iVar13 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar13 / 2 + iVar13;
      }
      iVar12 = iVar13 + 1;
      if (iVar13 + 1 < iVar5) {
        iVar12 = iVar5;
      }
      pIVar8 = (ImGuiOldColumnData *)MemAlloc((long)iVar12 * 0x1c);
      pIVar7 = (pIVar6->Columns).Data;
      if (pIVar7 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar8,pIVar7,(long)(pIVar6->Columns).Size * 0x1c);
        MemFree((pIVar6->Columns).Data);
      }
      (pIVar6->Columns).Data = pIVar8;
      (pIVar6->Columns).Capacity = iVar12;
      iVar13 = (pIVar6->Columns).Size;
    }
    else {
      pIVar8 = (pIVar6->Columns).Data;
    }
    pIVar8[iVar13].OffsetNorm = (float)(int)uVar11 / (float)columns_count;
    pIVar7 = pIVar8 + iVar13;
    pIVar7->OffsetNormBeforeResize = 0.0;
    pIVar7->Flags = 0;
    (((ImRect *)(&pIVar7->OffsetNormBeforeResize + 2))->Min).x = 0.0;
    (((ImRect *)(&pIVar7->OffsetNormBeforeResize + 2))->Min).y = 0.0;
    pIVar8[iVar13].ClipRect.Max.x = 0.0;
    pIVar8[iVar13].ClipRect.Max.y = 0.0;
    iVar13 = (pIVar6->Columns).Size + 1;
    (pIVar6->Columns).Size = iVar13;
    uVar11 = uVar11 + 1;
  } while (uVar9 != uVar11);
LAB_0019dfb2:
  lVar10 = 0xc;
  uVar14 = 0;
  do {
    if ((long)(pIVar6->Columns).Size <= (long)uVar14) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                    ,0x66a,
                    "T &ImVector<ImGuiOldColumnData>::operator[](int) [T = ImGuiOldColumnData]");
    }
    pIVar8 = (pIVar6->Columns).Data;
    fVar16 = (window->Pos).x;
    fVar15 = GetColumnOffset((int)uVar14);
    auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar15 + fVar16 + 0.5)));
    fVar16 = (window->Pos).x;
    uVar14 = uVar14 + 1;
    fVar15 = GetColumnOffset((int)uVar14);
    auVar18 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar15 + fVar16 + -1.0 + 0.5)));
    local_58 = auVar2._0_4_;
    *(undefined4 *)((long)&pIVar8->OffsetNorm + lVar10) = local_58;
    *(undefined4 *)((long)&pIVar8->OffsetNormBeforeResize + lVar10) = 0xff7fffff;
    *(int *)((long)&pIVar8->Flags + lVar10) = auVar18._0_4_;
    *(undefined4 *)((long)&(pIVar8->ClipRect).Min.x + lVar10) = 0x7f7fffff;
    ImRect::ClipWithFull((ImRect *)((long)&pIVar8->OffsetNorm + lVar10),&window->ClipRect);
    lVar10 = lVar10 + 0x1c;
  } while ((uint)columns_count != uVar14);
  if (1 < pIVar6->Count) {
    ImDrawListSplitter::Split(&pIVar6->Splitter,window->DrawList,pIVar6->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&pIVar6->Splitter,window->DrawList,1);
    PushColumnClipRect(0);
  }
  fVar16 = GetColumnOffset(pIVar6->Current);
  fVar15 = GetColumnOffset(pIVar6->Current + 1);
  PushItemWidth((fVar15 - fVar16) * 0.65);
  auVar18 = ZEXT416((uint)(fVar1 - (window->WindowPadding).x));
  auVar2 = vcmpss_avx(ZEXT816(0) << 0x40,auVar18,2);
  auVar2 = vandps_avx(auVar2,auVar18);
  (window->DC).ColumnsOffset.x = auVar2._0_4_;
  fVar16 = (window->Pos).x;
  auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar2._0_4_ + fVar16 + (window->DC).Indent.x)));
  (window->DC).CursorPos.x = auVar2._0_4_;
  (window->WorkRect).Max.x = (fVar16 + fVar15) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}